

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

int8_t msocket_state(msocket_t *self)

{
  uint8_t uVar1;
  
  if (self == (msocket_t *)0x0) {
    uVar1 = '\0';
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
    uVar1 = self->state;
    pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
  }
  return uVar1;
}

Assistant:

int8_t msocket_state(msocket_t *self){
   if(self != 0){
      uint8_t state;
      MUTEX_LOCK(self->mutex);
      state = self->state;
      MUTEX_UNLOCK(self->mutex);
      return state;
   }
   return 0;
}